

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

Name getMemoryName(BinaryenModuleRef module,char *memoryName)

{
  pointer puVar1;
  IString *this;
  undefined1 reuse;
  long in_RCX;
  string_view sVar2;
  
  if (memoryName == (char *)0x0) {
    puVar1 = (module->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    in_RCX = (long)(module->memories).
                   super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if (in_RCX == 8) {
      return (Name)*(string_view *)
                    (puVar1->_M_t).
                    super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    }
  }
  reuse = (undefined1)in_RCX;
  this = (IString *)strlen(memoryName);
  sVar2._M_str = (char *)0x0;
  sVar2._M_len = (size_t)memoryName;
  sVar2 = wasm::IString::interned(this,sVar2,(bool)reuse);
  return (IString)(IString)sVar2;
}

Assistant:

static Name getMemoryName(BinaryenModuleRef module, const char* memoryName) {
  if (memoryName == nullptr && module->memories.size() == 1) {
    return module->memories[0]->name;
  }

  return memoryName;
}